

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O2

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  Curl_handler *pCVar1;
  ulong uVar2;
  long lVar3;
  dynbuf *pdVar4;
  Curl_chunker *ch;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  uint uVar8;
  h1_tunnel_state_conflict *ts;
  timediff_t tVar9;
  size_t size;
  char *pcVar10;
  size_t sVar11;
  char *auth;
  curl_trc_feat *pcVar12;
  h1_tunnel_state_conflict *ts_00;
  Curl_easy *data_00;
  bool bVar13;
  _Bool local_8e;
  char byte;
  CURLcode local_8c;
  httpreq *local_88;
  h1_tunnel_state_conflict *local_80;
  size_t *local_78;
  _Bool *local_70;
  connectdata *local_68;
  dynbuf *local_60;
  Curl_chunker *local_58;
  curl_off_t *local_50;
  char *local_48;
  SingleRequest *local_40;
  ssize_t nread;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  ts = (h1_tunnel_state_conflict *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 || (0 < pcVar12->log_level))))
     && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect");
  }
  CVar6 = (*(code *)cf->next->cft->do_connect)(cf->next,data,done);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  if (ts == (h1_tunnel_state_conflict *)0x0) {
    pCVar1 = cf->conn->handler;
    if ((pCVar1->flags & 0x4000) != 0) {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar1->scheme);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    ts = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0xb0);
    if (ts == (h1_tunnel_state_conflict *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 || (0 < pcVar12->log_level)))
       ) {
      Curl_infof(data,"allocate connect buffer");
    }
    Curl_dyn_init((dynbuf *)ts,0x4000);
    Curl_dyn_init(&ts->request_data,0x100000);
    Curl_httpchunk_init(data,&ts->ch,true);
    data_00 = (Curl_easy *)0x0;
    Curl_conncontrol(cf->conn,0);
    tunnel_reinit((Curl_cfilter *)ts,data_00,ts_00);
    cf->ctx = ts;
  }
  local_80 = ts;
  if (ts->tunnel_state == H1_TUNNEL_ESTABLISHED) goto LAB_00113d08;
  if (ts->tunnel_state != H1_TUNNEL_FAILED) {
    local_68 = cf->conn;
    local_60 = &ts->request_data;
    local_78 = &ts->nsent;
    local_50 = &ts->cl;
    local_58 = &ts->ch;
    local_40 = &data->req;
    local_70 = done;
LAB_00113130:
    tVar9 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar9 < 1) {
      Curl_failf(data,"Proxy CONNECT aborted due to timeout");
      CVar6 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_00113deb;
    }
    switch(ts->tunnel_state) {
    case H1_TUNNEL_INIT:
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
           (0 < pcVar12->log_level)))) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT start");
      }
      local_88 = (httpreq *)0x0;
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      CVar6 = Curl_http_proxy_create_CONNECT(&local_88,cf,data,1);
      if (CVar6 == CURLE_OK) {
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
            (0 < pcVar12->log_level)))) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s",local_88->authority);
        }
        pdVar4 = local_60;
        Curl_dyn_reset(local_60);
        *local_78 = 0;
        local_78[1] = 0;
        CVar6 = Curl_h1_req_write_head
                          (local_88,(uint)((cf->conn->http_proxy).proxytype != '\x01'),pdVar4);
        if ((CVar6 != CURLE_OK) || (CVar6 = Curl_creader_set_null(data), CVar6 != CURLE_OK))
        goto LAB_00113258;
        CVar6 = CURLE_OK;
      }
      else {
LAB_00113258:
        Curl_failf(data,"Failed sending CONNECT to proxy");
      }
      if (local_88 != (httpreq *)0x0) {
        Curl_http_req_free(local_88);
      }
      if (CVar6 != CURLE_OK) goto LAB_00113deb;
      h1_tunnel_go_state(cf,local_80,H1_TUNNEL_CONNECT,data);
LAB_001132a2:
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         (((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
           (0 < pcVar12->log_level)) && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"CONNECT send");
      }
      break;
    case H1_TUNNEL_CONNECT:
      if (data != (Curl_easy *)0x0) goto LAB_001132a2;
      break;
    case H1_TUNNEL_RECEIVE:
      goto switchD_00113165_caseD_2;
    case H1_TUNNEL_RESPONSE:
      goto switchD_00113165_caseD_3;
    default:
      goto switchD_00113165_default;
    }
    pdVar4 = local_60;
    pcVar10 = Curl_dyn_ptr(local_60);
    sVar11 = Curl_dyn_len(pdVar4);
    local_88 = (httpreq *)((ulong)local_88 & 0xffffffff00000000);
    uVar2 = *local_78;
    if (uVar2 <= sVar11 && sVar11 - uVar2 != 0) {
      size = (*cf->next->cft->do_send)
                       (cf->next,data,pcVar10 + uVar2,sVar11 - uVar2,false,(CURLcode *)&local_88);
      if ((long)size < 0) {
        if ((CURLcode)local_88 == 0x51) goto LAB_00113373;
      }
      else {
        *local_78 = *local_78 + size;
        Curl_debug(data,CURLINFO_HEADER_OUT,pcVar10 + uVar2,size);
      }
      if ((CURLcode)local_88 != 0) {
        Curl_failf(data,"Failed sending CONNECT to proxy");
        if ((CURLcode)local_88 != CURLE_OK) {
          local_8e = false;
          CVar6 = (CURLcode)local_88;
          goto LAB_00113deb;
        }
      }
    }
LAB_00113373:
    ts = local_80;
    if (sVar11 <= *local_78) {
      h1_tunnel_go_state(cf,local_80,H1_TUNNEL_RECEIVE,data);
switchD_00113165_caseD_2:
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
           (0 < pcVar12->log_level)))) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT receive");
      }
      local_8e = false;
      _Var5 = Curl_conn_data_pending(data,cf->sockindex);
      local_8c = CURLE_OK;
      CVar6 = local_8c;
      if (_Var5) {
LAB_001133f5:
        if (ts->keepon == KEEPON_DONE) goto LAB_00113a71;
        CVar6 = Curl_conn_recv(data,cf->sockindex,&byte,1,&nread);
        if (CVar6 == CURLE_AGAIN) {
          local_8c = CURLE_OK;
          CVar6 = local_8c;
          goto LAB_00113ae5;
        }
        iVar7 = Curl_pgrsUpdate(data);
        ch = local_58;
        if (iVar7 != 0) {
          CVar6 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_00113ae5;
        }
        if (CVar6 != CURLE_OK) {
          ts->keepon = KEEPON_DONE;
          local_8e = true;
          bVar13 = true;
          local_8c = CVar6;
          goto LAB_00113ae8;
        }
        if (nread < 1) {
          if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) ||
             ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
            Curl_failf(data,"Proxy CONNECT aborted");
            ts->keepon = KEEPON_DONE;
            local_8e = true;
            local_8c = CURLE_RECV_ERROR;
            goto LAB_00113ab9;
          }
          ts->field_0xac = ts->field_0xac | 2;
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
              (0 < pcVar12->log_level)))) {
            Curl_infof(data,"Proxy CONNECT connection closed");
          }
          goto LAB_00113a69;
        }
        if (ts->keepon == KEEPON_IGNORE) {
          lVar3 = *local_50;
          if (lVar3 != 0) {
            *local_50 = lVar3 + -1;
            if (lVar3 < 2) goto LAB_00113a69;
            goto LAB_001133f5;
          }
          if ((ts->field_0xac & 1) == 0) goto LAB_001133f5;
          local_88 = (httpreq *)0x0;
          CVar6 = Curl_httpchunk_read(data,local_58,&byte,1,(size_t *)&local_88);
          if (CVar6 != CURLE_OK) goto LAB_00113ae5;
          _Var5 = Curl_httpchunk_is_done(data,ch);
          if (!_Var5) goto LAB_001133f5;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
              (0 < pcVar12->log_level)))) {
            Curl_infof(data,"chunk reading DONE");
          }
        }
        else {
          CVar6 = Curl_dyn_addn(&ts->rcvbuf,&byte,1);
          if (CVar6 != CURLE_OK) {
            Curl_failf(data,"CONNECT response too large");
            CVar6 = CURLE_RECV_ERROR;
            goto LAB_00113ae5;
          }
          if (byte != '\n') goto LAB_001133f5;
          ts->headerlines = ts->headerlines + 1;
          pcVar10 = Curl_dyn_ptr(&ts->rcvbuf);
          sVar11 = Curl_dyn_len(&ts->rcvbuf);
          Curl_debug(data,CURLINFO_HEADER_IN,pcVar10,sVar11);
          CVar6 = Curl_client_write(data,(uint)(ts->headerlines == 1) * 8 + 0x14,pcVar10,sVar11);
          done = local_70;
          if ((CVar6 != CURLE_OK) ||
             (CVar6 = Curl_bump_headersize(data,sVar11,true), done = local_70, ts = local_80,
             CVar6 != CURLE_OK)) goto LAB_00113ae5;
          if ((*pcVar10 != '\r') && (*pcVar10 != '\n')) {
            iVar7 = curl_strnequal(pcVar10,"WWW-Authenticate:",0x11);
            if ((iVar7 == 0) || ((data->req).httpcode != 0x191)) {
              iVar7 = curl_strnequal(pcVar10,"Proxy-authenticate:",0x13);
              if ((iVar7 != 0) && (_Var5 = true, (data->req).httpcode == 0x197)) goto LAB_0011368a;
              iVar7 = curl_strnequal(pcVar10,"Content-Length:",0xf);
              ts = local_80;
              if (iVar7 == 0) {
                _Var5 = Curl_compareheader(pcVar10,"Connection:",0xb,"close",5);
                ts = local_80;
                if (_Var5) {
LAB_001137fc:
                  ts->field_0xac = ts->field_0xac | 2;
                }
                else {
                  iVar7 = curl_strnequal(pcVar10,"Transfer-Encoding:",0x12);
                  if (iVar7 == 0) {
                    _Var5 = Curl_compareheader(pcVar10,"Proxy-Connection:",0x11,"close",5);
                    if (_Var5) goto LAB_001137fc;
                    iVar7 = strncmp(pcVar10,"HTTP/1.",7);
                    if (((((iVar7 == 0) && ((pcVar10[7] & 0xfeU) == 0x30)) && (pcVar10[8] == ' '))
                        && (((byte)(pcVar10[9] - 0x30U) < 10 && ((byte)(pcVar10[10] - 0x30U) < 10)))
                        ) && (((byte)(pcVar10[0xb] - 0x30U) < 10 &&
                              (9 < (byte)(pcVar10[0xc] - 0x30U))))) {
                      iVar7 = (uint)(byte)pcVar10[0xb] +
                              (uint)(byte)pcVar10[10] * 10 + (uint)(byte)pcVar10[9] * 100 + -0x14d0;
                      (data->req).httpcode = iVar7;
                      (data->info).httpproxycode = iVar7;
                    }
                  }
                  else if ((data->req).httpcode - 200U < 100) {
                    if ((((data->set).field_0x89f & 0x40) != 0) &&
                       ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar12->log_level)))) {
                      pcVar10 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                      goto LAB_00113773;
                    }
                  }
                  else {
                    _Var5 = Curl_compareheader(pcVar10,"Transfer-Encoding:",0x12,"chunked",7);
                    if (_Var5) {
                      if ((((data->set).field_0x89f & 0x40) != 0) &&
                         ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar12->log_level)))) {
                        Curl_infof(data,"CONNECT responded chunked");
                      }
                      ts->field_0xac = ts->field_0xac | 1;
                      Curl_httpchunk_reset(data,local_58,true);
                    }
                  }
                }
              }
              else if ((data->req).httpcode - 200U < 100) {
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar12->log_level)))) {
                  pcVar10 = "Ignoring Content-Length in CONNECT %03d response";
LAB_00113773:
                  Curl_infof(data,pcVar10);
                }
              }
              else {
                local_88 = (httpreq *)(pcVar10 + 0xf);
                iVar7 = Curl_str_numblanks((char **)&local_88,local_50);
                if (iVar7 != 0) {
                  Curl_failf(data,"Unsupported Content-Length value");
                  CVar6 = CURLE_WEIRD_SERVER_REPLY;
                  goto LAB_00113ae5;
                }
              }
            }
            else {
              _Var5 = false;
LAB_0011368a:
              auth = Curl_copy_header_value(pcVar10);
              if (auth == (char *)0x0) {
                CVar6 = CURLE_OUT_OF_MEMORY;
                goto LAB_00113ae5;
              }
              if ((((data->set).field_0x89f & 0x40) != 0) &&
                 (((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar12->log_level)) && (0 < cf->cft->log_level)))) {
                local_48 = auth;
                Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",pcVar10);
                auth = local_48;
              }
              CVar6 = Curl_http_input_auth(data,_Var5,auth);
              (*Curl_cfree)(auth);
              ts = local_80;
              if (CVar6 != CURLE_OK) goto LAB_00113ae5;
            }
            Curl_dyn_reset(&ts->rcvbuf);
            goto LAB_001133f5;
          }
          if (((data->req).httpcode == 0x197) && (((data->state).field_0x7be & 0x80) == 0)) {
            local_80->keepon = KEEPON_IGNORE;
            if (local_80->cl == 0) {
              uVar8 = (uint)*(undefined8 *)&(data->set).field_0x89c;
              if ((local_80->field_0xac & 1) == 0) {
                if ((((uVar8 >> 0x1e & 1) != 0) &&
                    ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar12->log_level)))) && (0 < cf->cft->log_level)) {
                  Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                }
                goto LAB_001137c9;
              }
              if (((uVar8 >> 0x1e & 1) != 0) &&
                 ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar12->log_level)))) {
                Curl_infof(data,"Ignore chunked response-body");
              }
            }
            else if ((((data->set).field_0x89f & 0x40) != 0) &&
                    ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar12->log_level)))) {
              Curl_infof(data,"Ignore %ld bytes of response-body");
            }
            goto LAB_001133f5;
          }
        }
LAB_001137c9:
        ts->keepon = KEEPON_DONE;
        goto LAB_001133f5;
      }
LAB_00113ae5:
      local_8c = CVar6;
      bVar13 = false;
      goto LAB_00113ae8;
    }
    goto LAB_00113d08;
  }
LAB_0011301a:
  CVar6 = CURLE_RECV_ERROR;
LAB_00113e02:
  *done = false;
  return CVar6;
LAB_00113a69:
  ts->keepon = KEEPON_DONE;
LAB_00113a71:
  local_8e = true;
  bVar13 = true;
  if (99 < (data->info).httpproxycode - 200U) {
    local_8c = Curl_http_auth_act(data);
LAB_00113ab9:
    bVar13 = true;
  }
LAB_00113ae8:
  iVar7 = Curl_pgrsUpdate(data);
  ts = local_80;
  if (iVar7 != 0) {
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
    goto LAB_00113deb;
  }
  CVar6 = local_8c;
  if (local_8c != CURLE_OK) goto LAB_00113deb;
  if (!bVar13) goto LAB_00113d08;
  h1_tunnel_go_state(cf,local_80,H1_TUNNEL_RESPONSE,data);
switchD_00113165_caseD_3:
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 || (0 < pcVar12->log_level))))
     && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"CONNECT response");
  }
  if ((data->req).newurl == (char *)0x0) goto LAB_00113c10;
  Curl_req_soft_reset(local_40,data);
  if (((ts->field_0xac & 2) == 0) && (((ulong)local_68->bits & 0x20) == 0)) {
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_INIT,data);
switchD_00113165_default:
    if ((data->req).newurl == (char *)0x0) goto LAB_00113c10;
    goto LAB_00113130;
  }
  if (((data->set).field_0x89f & 0x40) != 0) {
    pcVar12 = (data->state).feat;
    if ((pcVar12 == (curl_trc_feat *)0x0) || (0 < pcVar12->log_level)) {
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"CONNECT need to close+open");
        if (((data->set).field_0x89f & 0x40) == 0) goto LAB_00113cd8;
        pcVar12 = (data->state).feat;
      }
      if (pcVar12 != (curl_trc_feat *)0x0) goto LAB_00113cc1;
    }
    else {
LAB_00113cc1:
      if (pcVar12->log_level < 1) goto LAB_00113cd8;
    }
    Curl_infof(data,"Connect me again please");
  }
LAB_00113cd8:
  Curl_conn_cf_close(cf,data);
  Curl_conncontrol(local_68,0);
  CVar6 = Curl_conn_cf_connect(cf->next,data,&local_8e);
  if (CVar6 == CURLE_OK) goto LAB_00113d08;
LAB_00113deb:
  h1_tunnel_go_state(cf,local_80,H1_TUNNEL_FAILED,data);
  goto LAB_00113e02;
LAB_00113c10:
  if ((data->info).httpproxycode - 200U < 100) {
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_ESTABLISHED,data);
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar12 = (data->state).feat, pcVar12 == (curl_trc_feat *)0x0 || (0 < pcVar12->log_level)))
       ) {
      Curl_infof(data,"CONNECT tunnel established, response %d",
                 (ulong)(uint)(data->info).httpproxycode);
    }
LAB_00113d08:
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
    if (cf->ctx == (void *)0x0) {
      *done = false;
      return CURLE_OK;
    }
    bVar13 = *(int *)((long)cf->ctx + 0xa8) == 4;
    *done = bVar13;
    if (!bVar13) {
      return CURLE_OK;
    }
    cf->field_0x24 = cf->field_0x24 | 1;
    Curl_req_soft_reset(&data->req,data);
    Curl_client_reset(data);
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
    tunnel_free(cf,data);
    return CURLE_OK;
  }
  (*Curl_cfree)((void *)0x0);
  (data->req).newurl = (char *)0x0;
  Curl_conncontrol(local_68,2);
  h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
  Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
  goto LAB_0011301a;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* The real request will follow the CONNECT, reset request partially */
    Curl_req_soft_reset(&data->req, data);
    Curl_client_reset(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}